

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O0

void __thiscall Sap_Apu::run_until(Sap_Apu *this,blip_time_t end_time)

{
  byte bVar1;
  Sap_Apu_Impl *pSVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int in_ESI;
  Blip_Synth<12,_1> *in_RDI;
  blip_time_t duration;
  blargg_long count;
  blip_time_t remain;
  int delta_2;
  int amp;
  blip_time_t end;
  int delta_1;
  int osc_last_amp;
  int poly5_inc;
  blargg_ulong wave;
  int poly_inc;
  int poly_pos;
  int poly_len;
  byte_ *poly;
  blip_time_t time2;
  blip_time_t period2;
  int delta;
  int volume;
  int osc_control;
  Blip_Buffer *output;
  blip_time_t period;
  blip_time_t time;
  osc_t *osc;
  int i;
  int polym_len;
  byte_ *polym;
  Sap_Apu_Impl *impl;
  int in_stack_ffffffffffffff58;
  undefined3 uVar6;
  blip_time_t in_stack_ffffffffffffff5c;
  Blip_Synth<12,_1> *this_00;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  blargg_ulong local_70;
  int local_6c;
  uint local_68;
  int local_64;
  byte *local_60;
  int local_54;
  int local_50;
  uint local_48;
  int local_34;
  int local_28;
  int local_24;
  byte *local_20;
  
  calc_periods((Sap_Apu *)in_RDI);
  pSVar2 = *(Sap_Apu_Impl **)(in_RDI->impulses + 0x1c);
  local_20 = pSVar2->poly17;
  local_24 = 0x1ffff;
  if ((*(uint *)(in_RDI->impulses + 0x28) & 0x80) != 0) {
    local_24 = 0x1ff;
    local_20 = pSVar2->poly9;
  }
  *(int *)(in_RDI->impulses + 0x26) = *(int *)(in_RDI->impulses + 0x26) % local_24;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    local_34 = *(int *)(in_RDI->impulses + 0x20) +
               *(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0x10);
    iVar5 = *(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0xe);
    this_00 = in_RDI;
    if (*(Blip_Buffer **)(in_RDI->impulses + (long)local_28 * 0xc + -0xc) != (Blip_Buffer *)0x0) {
      Blip_Buffer::set_modified(*(Blip_Buffer **)(in_RDI->impulses + (long)local_28 * 0xc + -0xc));
      bVar1 = *(byte *)((long)in_RDI->impulses + (long)local_28 * 0x18 + -0x27);
      uVar3 = bVar1 & 0xf;
      local_48 = uVar3 * 2;
      if ((((bVar1 & 0xf) == 0) || ((bVar1 & 0x10) != 0)) ||
         (((bVar1 & 0xa0) == 0xa0 && (iVar5 < 0x4a)))) {
        if ((bVar1 & 0x10) == 0) {
          local_48 = (int)local_48 >> 1;
        }
        if (local_48 != *(uint *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12)) {
          *(uint *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12) = local_48;
          Blip_Synth<12,_1>::offset
                    (this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                     (Blip_Buffer *)0x82f712);
        }
      }
      else {
        local_50 = 0;
        local_54 = in_ESI;
        if ((*(uint *)(this_00->impulses + 0x28) & (uint)"\x04\x02"[local_28]) != 0) {
          local_50 = *(int *)(in_RDI->impulses + (long)local_28 * 0xc + 10);
          local_54 = *(int *)(this_00->impulses + 0x20) +
                     *(int *)(in_RDI->impulses + (long)local_28 * 0xc + 8);
          if (*(char *)((long)in_RDI->impulses + (long)local_28 * 0x18 + -0x25) != '\0') {
            *(uint *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12) =
                 *(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12) + uVar3 * -2;
            local_48 = uVar3 * -2;
          }
        }
        if ((local_34 < in_ESI) || (local_54 < in_ESI)) {
          local_60 = "UU";
          local_64 = 0x10;
          local_68 = (byte)in_RDI->impulses[(long)local_28 * 0xc + -0x13] & 1;
          local_6c = 1;
          if ((bVar1 & 0x20) == 0) {
            local_60 = local_20;
            local_64 = local_24;
            local_68 = *(uint *)(this_00->impulses + 0x26);
            if ((bVar1 & 0x40) != 0) {
              local_60 = pSVar2->poly4;
              local_64 = 0xf;
              local_68 = *(uint *)(this_00->impulses + 0x24);
            }
            local_6c = iVar5 % local_64;
            local_68 = (int)(local_68 + *(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0x10)) %
                       local_64;
          }
          local_70 = 0x167c6ea1;
          local_74 = 0;
          if ((bVar1 & 0x80) == 0) {
            local_70 = run_poly5(0x167c6ea1,
                                 (*(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0x10) +
                                 *(int *)(this_00->impulses + 0x22)) % 0x1f);
            local_74 = iVar5 % 0x1f;
          }
          local_78 = *(uint *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12);
          do {
            if (local_54 < local_34) {
              local_7c = -local_78;
              if ((int)local_48 < 0) {
                local_7c = local_48 + local_7c;
              }
              if (local_7c != 0) {
                local_78 = (local_7c - local_48) + local_78;
                local_48 = -local_48;
                Blip_Synth<12,_1>::offset
                          (this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                           (Blip_Buffer *)0x82f935);
              }
            }
            for (; local_54 <= local_34; local_54 = local_50 + local_54) {
            }
            local_80 = in_ESI;
            if (local_54 < in_ESI) {
              local_80 = local_54;
            }
            for (; local_34 < local_80; local_34 = iVar5 + local_34) {
              if ((local_70 & 1) != 0) {
                uVar3 = local_48 &
                        -((int)(uint)local_60[(int)local_68 >> 3] >> ((byte)local_68 & 7) & 1U);
                local_68 = (local_6c - local_64) + local_68;
                if ((int)local_68 < 0) {
                  local_68 = local_64 + local_68;
                }
                if (uVar3 != local_78) {
                  Blip_Synth<12,_1>::offset
                            (this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                             (Blip_Buffer *)0x82fa0d);
                  local_78 = uVar3;
                }
              }
              local_70 = run_poly5(local_70,local_74);
            }
            uVar6 = (undefined3)in_stack_ffffffffffffff5c;
            in_stack_ffffffffffffff5c = CONCAT13(1,uVar6);
            if (in_ESI <= local_34) {
              in_stack_ffffffffffffff5c = CONCAT13(local_54 < in_ESI,uVar6);
            }
          } while ((char)((uint)in_stack_ffffffffffffff5c >> 0x18) != '\0');
          *(byte *)(in_RDI->impulses + (long)local_28 * 0xc + -0x13) = (byte)local_68;
          *(uint *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12) = local_78;
        }
        *(undefined1 *)((long)in_RDI->impulses + (long)local_28 * 0x18 + -0x25) = 0;
        if ((int)local_48 < 0) {
          *(uint *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12) =
               *(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0x12) - local_48;
          *(undefined1 *)((long)in_RDI->impulses + (long)local_28 * 0x18 + -0x25) = 1;
        }
      }
    }
    if (0 < in_ESI - local_34) {
      iVar4 = ((in_ESI - local_34) + iVar5 + -1) / iVar5;
      *(byte *)(in_RDI->impulses + (long)local_28 * 0xc + -0x13) =
           (byte)in_RDI->impulses[(long)local_28 * 0xc + -0x13] ^ (byte)iVar4;
      local_34 = iVar4 * iVar5 + local_34;
    }
    *(int *)(in_RDI->impulses + (long)local_28 * 0xc + -0x10) = local_34 - in_ESI;
    in_RDI = this_00;
  }
  iVar5 = in_ESI - *(int *)(in_RDI->impulses + 0x20);
  *(int *)(in_RDI->impulses + 0x20) = in_ESI;
  *(int *)(in_RDI->impulses + 0x24) = (*(int *)(in_RDI->impulses + 0x24) + iVar5) % 0xf;
  *(int *)(in_RDI->impulses + 0x22) = (*(int *)(in_RDI->impulses + 0x22) + iVar5) % 0x1f;
  *(int *)(in_RDI->impulses + 0x26) = iVar5 + *(int *)(in_RDI->impulses + 0x26);
  return;
}

Assistant:

void Sap_Apu::run_until( blip_time_t end_time )
{
	calc_periods();
	Sap_Apu_Impl* const impl = this->impl; // cache
	
	// 17/9-bit poly selection
	byte const* polym = impl->poly17;
	int polym_len = poly17_len;
	if ( this->control & 0x80 )
	{
		polym_len = poly9_len;
		polym = impl->poly9;
	}
	polym_pos %= polym_len;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		osc_t* const osc = &oscs [i];
		blip_time_t time = last_time + osc->delay;
		blip_time_t const period = osc->period;
		
		// output
		Blip_Buffer* output = osc->output;
		if ( output )
		{
			output->set_modified();
			
			int const osc_control = osc->regs [1]; // cache
			int volume = (osc_control & 0x0F) * 2;
			if ( !volume || osc_control & 0x10 || // silent, DAC mode, or inaudible frequency
					((osc_control & 0xA0) == 0xA0 && period < 1789773 / 2 / max_frequency) )
			{
				if ( !(osc_control & 0x10) )
					volume >>= 1; // inaudible frequency = half volume
				
				int delta = volume - osc->last_amp;
				if ( delta )
				{
					osc->last_amp = volume;
					impl->synth.offset( last_time, delta, output );
				}
				
				// TODO: doesn't maintain high pass flip-flop (very minor issue)
			}
			else
			{
				// high pass
				static byte const hipass_bits [osc_count] = { 1 << 2, 1 << 1, 0, 0 };
				blip_time_t period2 = 0; // unused if no high pass
				blip_time_t time2 = end_time;
				if ( this->control & hipass_bits [i] )
				{
					period2 = osc [2].period;
					time2 = last_time + osc [2].delay;
					if ( osc->invert )
					{
						// trick inner wave loop into inverting output
						osc->last_amp -= volume;
						volume = -volume;
					}
				}
				
				if ( time < end_time || time2 < end_time )
				{
					// poly source
					static byte const poly1 [] = { 0x55, 0x55 }; // square wave
					byte const* poly = poly1;
					int poly_len = 8 * sizeof poly1; // can be just 2 bits, but this is faster
					int poly_pos = osc->phase & 1;
					int poly_inc = 1;
					if ( !(osc_control & 0x20) )
					{
						poly     = polym;
						poly_len = polym_len;
						poly_pos = polym_pos;
						if ( osc_control & 0x40 )
						{
							poly     = impl->poly4;
							poly_len = poly4_len;
							poly_pos = poly4_pos;
						}
						poly_inc = period % poly_len;
						poly_pos = (poly_pos + osc->delay) % poly_len;
					}
					poly_inc -= poly_len; // allows more optimized inner loop below
					
					// square/poly5 wave
					blargg_ulong wave = poly5;
					check( poly5 & 1 ); // low bit is set for pure wave
					int poly5_inc = 0;
					if ( !(osc_control & 0x80) )
					{
						wave = run_poly5( wave, (osc->delay + poly5_pos) % poly5_len );
						poly5_inc = period % poly5_len;
					}
					
					// Run wave and high pass interleved with each catching up to the other.
					// Disabled high pass has no performance effect since inner wave loop
					// makes no compromise for high pass, and only runs once in that case.
					int osc_last_amp = osc->last_amp;
					do
					{
						// run high pass
						if ( time2 < time )
						{
							int delta = -osc_last_amp;
							if ( volume < 0 )
								delta += volume;
							if ( delta )
							{
								osc_last_amp += delta - volume;
								volume = -volume;
								impl->synth.offset( time2, delta, output );
							}
						}
						while ( time2 <= time ) // must advance *past* time to avoid hang
							time2 += period2;
						
						// run wave
						blip_time_t end = end_time;
						if ( end > time2 )
							end = time2;
						while ( time < end )
						{
							if ( wave & 1 )
							{
								int amp = volume & -(poly [poly_pos >> 3] >> (poly_pos & 7) & 1);
								if ( (poly_pos += poly_inc) < 0 )
									poly_pos += poly_len;
								int delta = amp - osc_last_amp;
								if ( delta )
								{
									osc_last_amp = amp;
									impl->synth.offset( time, delta, output );
								}
							}
							wave = run_poly5( wave, poly5_inc );
							time += period;
						}
					}
					while ( time < end_time || time2 < end_time );
					
					osc->phase = poly_pos;
					osc->last_amp = osc_last_amp;
				}
				
				osc->invert = 0;
				if ( volume < 0 )
				{
					// undo inversion trickery
					osc->last_amp -= volume;
					osc->invert = 1;
				}
			}
		}
		
		// maintain divider
		blip_time_t remain = end_time - time;
		if ( remain > 0 )
		{
			blargg_long count = (remain + period - 1) / period;
			osc->phase ^= count;
			time += count * period;
		}
		osc->delay = time - end_time;
	}
	
	// advance polies
	blip_time_t duration = end_time - last_time;
	last_time = end_time;
	poly4_pos = (poly4_pos + duration) % poly4_len;
	poly5_pos = (poly5_pos + duration) % poly5_len;
	polym_pos += duration; // will get %'d on next call
}